

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASParallelOperationDestroyExt
          (ze_rtas_parallel_operation_ext_handle_t hParallelOperation)

{
  ze_pfnRTASParallelOperationDestroyExt_t pfnDestroyExt;
  ze_result_t result;
  ze_rtas_parallel_operation_ext_handle_t hParallelOperation_local;
  
  pfnDestroyExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c198 != (code *)0x0) {
    pfnDestroyExt._4_4_ = (*DAT_0011c198)(hParallelOperation);
  }
  return pfnDestroyExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationDestroyExt(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation  ///< [in][release] handle of parallel operation object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExt = context.zeDdiTable.RTASParallelOperation.pfnDestroyExt;
        if( nullptr != pfnDestroyExt )
        {
            result = pfnDestroyExt( hParallelOperation );
        }
        else
        {
            // generic implementation

        }

        return result;
    }